

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O0

Constraint *
create_xmlNode_has_attribute_equal_to(xmlChar *attr,xmlChar *value,char *expected_value_name)

{
  Constraint *pCVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  xmlNode_has_attribute_equal_to *expected;
  Constraint *constraint;
  undefined8 local_48;
  anon_union_8_4_d526cc82_for_value local_40;
  size_t local_38;
  undefined8 *local_30;
  Constraint *local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  Constraint *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = (Constraint *)create_constraint();
  if (local_28 == (Constraint *)0x0) {
    local_8 = (Constraint *)0x0;
  }
  else {
    local_30 = (undefined8 *)malloc(0x10);
    if (local_30 == (undefined8 *)0x0) {
      (*local_28->destroy)(local_28);
      local_8 = (Constraint *)0x0;
    }
    else {
      uVar2 = xmlStrdup(local_10);
      *local_30 = uVar2;
      uVar2 = xmlStrdup(local_18);
      pCVar1 = local_28;
      local_30[1] = uVar2;
      make_cgreen_pointer_value(&local_48,local_30);
      *(undefined8 *)&pCVar1->expected_value = local_48;
      (pCVar1->expected_value).value = local_40;
      (pCVar1->expected_value).value_size = local_38;
      pcVar3 = strdup(local_20);
      local_28->expected_value_name = pcVar3;
      local_28->type = CGREEN_STRING_COMPARER_CONSTRAINT;
      local_28->compare = compare_xmlNode_has_attribute_equal_to;
      local_28->failure_message = failure_message_xmlNode_has_attribute_equal_to;
      local_28->name = "have attribute with value";
      local_28->size_of_expected_value = 8;
      local_28->destroy = destroy_xmlNode_has_attribute_equal_to;
      local_8 = local_28;
    }
  }
  return local_8;
}

Assistant:

static Constraint *create_xmlNode_has_attribute_equal_to(const xmlChar* attr,
                                                         const xmlChar *value,
                                                         const char* expected_value_name)
{
    Constraint *constraint = create_constraint();
    if (!constraint)
        return NULL;

    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to *)malloc(sizeof(struct xmlNode_has_attribute_equal_to));
    if (!expected) {
        constraint->destroy(constraint);
        return NULL;
    }

    expected->attr = xmlStrdup(attr);
    expected->value = xmlStrdup(value);

    constraint->expected_value = make_cgreen_pointer_value(expected);
    constraint->expected_value_name = strdup(expected_value_name);
    constraint->type = CGREEN_STRING_COMPARER_CONSTRAINT;

    constraint->compare = &compare_xmlNode_has_attribute_equal_to;
    constraint->failure_message = &failure_message_xmlNode_has_attribute_equal_to;
    constraint->name = "have attribute with value";
    constraint->size_of_expected_value = sizeof(intptr_t);
    constraint->destroy = &destroy_xmlNode_has_attribute_equal_to;

    return constraint;
}